

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppression::NonMaximumSuppression
          (NonMaximumSuppression *this,NonMaximumSuppression *from)

{
  SuppressionMethodCase SVar1;
  ClassLabelsCase CVar2;
  string *psVar3;
  ulong uVar4;
  Arena *pAVar5;
  NonMaximumSuppression_PickTop *this_00;
  NonMaximumSuppression_PickTop *from_00;
  StringVector *this_01;
  StringVector *from_01;
  Int64Vector *this_02;
  Int64Vector *from_02;
  NonMaximumSuppression *from_local;
  NonMaximumSuppression *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NonMaximumSuppression_006f9bf0;
  SuppressionMethodUnion::SuppressionMethodUnion
            ((SuppressionMethodUnion *)&this->SuppressionMethod_);
  ClassLabelsUnion::ClassLabelsUnion((ClassLabelsUnion *)&this->ClassLabels_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->confidenceinputfeaturename_,psVar3);
  _internal_confidenceinputfeaturename_abi_cxx11_(from);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar3 = _internal_confidenceinputfeaturename_abi_cxx11_(from);
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->confidenceinputfeaturename_,psVar3,pAVar5);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->coordinatesinputfeaturename_,psVar3);
  _internal_coordinatesinputfeaturename_abi_cxx11_(from);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar3 = _internal_coordinatesinputfeaturename_abi_cxx11_(from);
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->coordinatesinputfeaturename_,psVar3,pAVar5);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->iouthresholdinputfeaturename_,psVar3);
  _internal_iouthresholdinputfeaturename_abi_cxx11_(from);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar3 = _internal_iouthresholdinputfeaturename_abi_cxx11_(from);
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->iouthresholdinputfeaturename_,psVar3,pAVar5);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->confidencethresholdinputfeaturename_,psVar3);
  _internal_confidencethresholdinputfeaturename_abi_cxx11_(from);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar3 = _internal_confidencethresholdinputfeaturename_abi_cxx11_(from);
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->confidencethresholdinputfeaturename_,psVar3,pAVar5);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->confidenceoutputfeaturename_,psVar3);
  _internal_confidenceoutputfeaturename_abi_cxx11_(from);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar3 = _internal_confidenceoutputfeaturename_abi_cxx11_(from);
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->confidenceoutputfeaturename_,psVar3,pAVar5);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->coordinatesoutputfeaturename_,psVar3);
  _internal_coordinatesoutputfeaturename_abi_cxx11_(from);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar3 = _internal_coordinatesoutputfeaturename_abi_cxx11_(from);
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->coordinatesoutputfeaturename_,psVar3,pAVar5);
  }
  memcpy(&this->iouthreshold_,&from->iouthreshold_,(long)this + (0x50 - (long)&this->iouthreshold_))
  ;
  clear_has_SuppressionMethod(this);
  SVar1 = SuppressionMethod_case(from);
  if ((SVar1 != SUPPRESSIONMETHOD_NOT_SET) && (SVar1 == kPickTop)) {
    this_00 = _internal_mutable_picktop(this);
    from_00 = _internal_picktop(from);
    NonMaximumSuppression_PickTop::MergeFrom(this_00,from_00);
  }
  clear_has_ClassLabels(this);
  CVar2 = ClassLabels_case(from);
  if (CVar2 != CLASSLABELS_NOT_SET) {
    if (CVar2 == kStringClassLabels) {
      this_01 = _internal_mutable_stringclasslabels(this);
      from_01 = _internal_stringclasslabels(from);
      StringVector::MergeFrom(this_01,from_01);
    }
    else if (CVar2 == kInt64ClassLabels) {
      this_02 = _internal_mutable_int64classlabels(this);
      from_02 = _internal_int64classlabels(from);
      Int64Vector::MergeFrom(this_02,from_02);
    }
  }
  return;
}

Assistant:

NonMaximumSuppression::NonMaximumSuppression(const NonMaximumSuppression& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  confidenceinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    confidenceinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_confidenceinputfeaturename().empty()) {
    confidenceinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_confidenceinputfeaturename(), 
      GetArenaForAllocation());
  }
  coordinatesinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    coordinatesinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_coordinatesinputfeaturename().empty()) {
    coordinatesinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_coordinatesinputfeaturename(), 
      GetArenaForAllocation());
  }
  iouthresholdinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    iouthresholdinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_iouthresholdinputfeaturename().empty()) {
    iouthresholdinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_iouthresholdinputfeaturename(), 
      GetArenaForAllocation());
  }
  confidencethresholdinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    confidencethresholdinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_confidencethresholdinputfeaturename().empty()) {
    confidencethresholdinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_confidencethresholdinputfeaturename(), 
      GetArenaForAllocation());
  }
  confidenceoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    confidenceoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_confidenceoutputfeaturename().empty()) {
    confidenceoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_confidenceoutputfeaturename(), 
      GetArenaForAllocation());
  }
  coordinatesoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    coordinatesoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_coordinatesoutputfeaturename().empty()) {
    coordinatesoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_coordinatesoutputfeaturename(), 
      GetArenaForAllocation());
  }
  ::memcpy(&iouthreshold_, &from.iouthreshold_,
    static_cast<size_t>(reinterpret_cast<char*>(&confidencethreshold_) -
    reinterpret_cast<char*>(&iouthreshold_)) + sizeof(confidencethreshold_));
  clear_has_SuppressionMethod();
  switch (from.SuppressionMethod_case()) {
    case kPickTop: {
      _internal_mutable_picktop()->::CoreML::Specification::NonMaximumSuppression_PickTop::MergeFrom(from._internal_picktop());
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      _internal_mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NonMaximumSuppression)
}